

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_sparse.c
# Opt level: O0

void verify_write_data(archive *a,int sparse)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  char *__s;
  archive_entry *entry;
  la_ssize_t lVar4;
  char *pcVar5;
  FILE *__stream;
  size_t sVar6;
  FILE *f;
  char *msg;
  char *p;
  char *buff;
  size_t buff_size;
  archive_entry *ae;
  stat_conflict st;
  int sparse_local;
  archive *a_local;
  
  pcVar3 = "non-sparse";
  if (sparse != 0) {
    pcVar3 = "sparse";
  }
  st.__glibc_reserved[2]._4_4_ = sparse;
  __s = (char *)malloc(0x10000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                   ,L'-',(uint)(__s != (char *)0x0),"buff != NULL",(void *)0x0);
  if (__s != (char *)0x0) {
    entry = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                     ,L'2',(uint)(entry != (archive_entry *)0x0),"ae != NULL",(void *)0x0);
    archive_entry_set_size(entry,0x80000);
    archive_entry_set_pathname(entry,"test_write_data");
    archive_entry_set_mode(entry,0x81ed);
    iVar1 = archive_write_header(a,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                        ,L'6',0,"0",(long)iVar1,"archive_write_header(a, ae)",a);
    memset(__s,0,0x10000);
    builtin_strncpy(__s,"abcdefghijklmnopqrstuvwxyz",0x1b);
    failure("%s",pcVar3);
    lVar4 = archive_write_data(a,__s,0x10000);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                        ,L'>',0x10000,"buff_size",lVar4,"archive_write_data(a, buff, buff_size)",
                        (void *)0x0);
    memset(__s,0,0x10000);
    builtin_strncpy(__s + 0x7ffd,"abcdefghijklmnopqrstuvwxyz",0x1b);
    failure("%s",pcVar3);
    lVar4 = archive_write_data(a,__s,0x10000);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                        ,L'D',0x10000,"buff_size",lVar4,"archive_write_data(a, buff, buff_size)",
                        (void *)0x0);
    memset(__s,0,0x10000);
    builtin_strncpy(__s + 0xffe5,"abcdefghijklmnopqrstuvwxyz",0x1b);
    failure("%s",pcVar3);
    lVar4 = archive_write_data(a,__s,0x10000);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                        ,L'J',0x10000,"buff_size",lVar4,"archive_write_data(a, buff, buff_size)",
                        (void *)0x0);
    failure("%s",pcVar3);
    iVar1 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                        ,L'M',0,"0",(long)iVar1,"archive_write_finish_entry(a)",a);
    pcVar5 = archive_entry_pathname(entry);
    iVar1 = stat(pcVar5,(stat *)&ae);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                     ,L'P',(uint)(iVar1 == 0),"0 == stat(archive_entry_pathname(ae), &st)",
                     (void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                        ,L'Q',st.st_rdev,"st.st_size",0x80000,"8 * buff_size",(void *)0x0);
    pcVar5 = archive_entry_pathname(entry);
    __stream = fopen(pcVar5,"rb");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                     ,L'S',(uint)(__stream != (FILE *)0x0),"f != NULL",(void *)0x0);
    if (__stream == (FILE *)0x0) {
      free(__s);
    }
    else {
      sVar6 = fread(__s,1,0x10000,__stream);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                          ,L'Z',0x10000,"buff_size",sVar6,"fread(buff, 1, buff_size, f)",(void *)0x0
                         );
      failure("%s",pcVar3);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                          ,L'\\',__s,"buff","abcdefghijklmnopqrstuvwxyz","data",0x1b,"sizeof(data)",
                          (void *)0x0);
      for (msg = __s + 0x1b; iVar1 = (int)__s, msg < __s + 0x10000; msg = msg + 1) {
        failure("offset: %d, %s",(ulong)(uint)((int)msg - iVar1),pcVar3);
        wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                                    ,L'_',0,"0",(long)*msg,"*p",(void *)0x0);
        if (wVar2 == L'\0') break;
      }
      sVar6 = fread(__s,1,0x10000,__stream);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                          ,L'd',0x10000,"buff_size",sVar6,"fread(buff, 1, buff_size, f)",(void *)0x0
                         );
      for (msg = __s; msg < __s + 0x10000; msg = msg + 1) {
        failure("offset: %d, %s",(ulong)(uint)((int)msg - iVar1),pcVar3);
        if (msg == __s + 0x7ffd) {
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                              ,L'h',msg,"p","abcdefghijklmnopqrstuvwxyz","data",0x1b,"sizeof(data)",
                              (void *)0x0);
          msg = msg + 0x1b;
        }
        else {
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                                      ,L'j',0,"0",(long)*msg,"*p",(void *)0x0);
          if (wVar2 == L'\0') break;
        }
      }
      sVar6 = fread(__s,1,0x10000,__stream);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                          ,L'o',0x10000,"buff_size",sVar6,"fread(buff, 1, buff_size, f)",(void *)0x0
                         );
      for (msg = __s; msg < __s + 0xffe5; msg = msg + 1) {
        failure("offset: %d, %s",(ulong)(uint)((int)msg - iVar1),pcVar3);
        wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                                    ,L'r',0,"0",(long)*msg,"*p",(void *)0x0);
        if (wVar2 == L'\0') break;
      }
      failure("%s",pcVar3);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                          ,L'v',__s + 0xffe5,"buff + buff_size - sizeof(data)",
                          "abcdefghijklmnopqrstuvwxyz","data",0x1b,"sizeof(data)",(void *)0x0);
      iVar1 = fclose(__stream);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_sparse.c"
                          ,L'z',0,"0",(long)iVar1,"fclose(f)",(void *)0x0);
      archive_entry_free(entry);
      free(__s);
    }
  }
  return;
}

Assistant:

static void
verify_write_data(struct archive *a, int sparse)
{
	static const char data[]="abcdefghijklmnopqrstuvwxyz";
	struct stat st;
	struct archive_entry *ae;
	size_t buff_size = 64 * 1024;
	char *buff, *p;
	const char *msg = sparse ? "sparse" : "non-sparse";
	FILE *f;

	buff = malloc(buff_size);
	assert(buff != NULL);
	if (buff == NULL)
		return;

	ae = archive_entry_new();
	assert(ae != NULL);
	archive_entry_set_size(ae, 8 * buff_size);
	archive_entry_set_pathname(ae, "test_write_data");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualIntA(a, 0, archive_write_header(a, ae));

	/* Use archive_write_data() to write three relatively sparse blocks. */

	/* First has non-null data at beginning. */
	memset(buff, 0, buff_size);
	memcpy(buff, data, sizeof(data));
	failure("%s", msg);
	assertEqualInt(buff_size, archive_write_data(a, buff, buff_size));

	/* Second has non-null data in the middle. */
	memset(buff, 0, buff_size);
	memcpy(buff + buff_size / 2 - 3, data, sizeof(data));
	failure("%s", msg);
	assertEqualInt(buff_size, archive_write_data(a, buff, buff_size));

	/* Third has non-null data at the end. */
	memset(buff, 0, buff_size);
	memcpy(buff + buff_size - sizeof(data), data, sizeof(data));
	failure("%s", msg);
	assertEqualInt(buff_size, archive_write_data(a, buff, buff_size));

	failure("%s", msg);
	assertEqualIntA(a, 0, archive_write_finish_entry(a));

	/* Test the entry on disk. */
	assert(0 == stat(archive_entry_pathname(ae), &st));
        assertEqualInt(st.st_size, 8 * buff_size);
	f = fopen(archive_entry_pathname(ae), "rb");
	assert(f != NULL);
	if (f == NULL) {
		free(buff);
		return;
	}

	/* Check first block. */
	assertEqualInt(buff_size, fread(buff, 1, buff_size, f));
	failure("%s", msg);
	assertEqualMem(buff, data, sizeof(data));
	for (p = buff + sizeof(data); p < buff + buff_size; ++p) {
		failure("offset: %d, %s", (int)(p - buff), msg);
		if (!assertEqualInt(0, *p))
			break;
	}

	/* Check second block. */
	assertEqualInt(buff_size, fread(buff, 1, buff_size, f));
	for (p = buff; p < buff + buff_size; ++p) {
		failure("offset: %d, %s", (int)(p - buff), msg);
		if (p == buff + buff_size / 2 - 3) {
			assertEqualMem(p, data, sizeof(data));
			p += sizeof(data);
		} else if (!assertEqualInt(0, *p))
			break;
	}

	/* Check third block. */
	assertEqualInt(buff_size, fread(buff, 1, buff_size, f));
	for (p = buff; p < buff + buff_size - sizeof(data); ++p) {
		failure("offset: %d, %s", (int)(p - buff), msg);
		if (!assertEqualInt(0, *p))
			break;
	}
	failure("%s", msg);
	assertEqualMem(buff + buff_size - sizeof(data), data, sizeof(data));

	/* XXX more XXX */

	assertEqualInt(0, fclose(f));
	archive_entry_free(ae);
	free(buff);
}